

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O3

void __thiscall QFormLayoutPrivate::setupHfwLayoutData(QFormLayoutPrivate *this)

{
  QList<QLayoutStruct> *this_00;
  int iVar1;
  int iVar2;
  QFormLayout *this_01;
  QLayoutStruct *pQVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  pointer pQVar13;
  pointer ppQVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  uint local_58;
  
  this_01 = *(QFormLayout **)&(this->super_QLayoutPrivate).field_0x8;
  uVar17 = (this->m_matrix).m_storage.d.size;
  this_00 = &this->hfwLayouts;
  QList<QLayoutStruct>::clear(this_00);
  QList<QLayoutStruct>::resize(this_00,(long)this->vLayoutCount);
  if (0 < this->vLayoutCount) {
    lVar16 = 0;
    lVar18 = 0;
    do {
      pQVar3 = (this->vLayouts).d.ptr;
      pQVar13 = QList<QLayoutStruct>::data(this_00);
      puVar4 = (undefined8 *)((long)&pQVar3->stretch + lVar16);
      uVar6 = *puVar4;
      uVar7 = puVar4[1];
      puVar4 = (undefined8 *)((long)&pQVar3->spacing + lVar16);
      uVar8 = puVar4[1];
      puVar5 = (undefined8 *)((long)&pQVar13->spacing + lVar16);
      *puVar5 = *puVar4;
      puVar5[1] = uVar8;
      puVar4 = (undefined8 *)((long)&pQVar13->stretch + lVar16);
      *puVar4 = uVar6;
      puVar4[1] = uVar7;
      lVar18 = lVar18 + 1;
      lVar16 = lVar16 + 0x20;
    } while (lVar18 < this->vLayoutCount);
  }
  local_58 = (uint)(uVar17 >> 1);
  if (0 < (int)local_58) {
    lVar16 = 0;
    uVar17 = 0;
    do {
      ppQVar14 = QList<QFormLayoutItem_*>::data(&(this->m_matrix).m_storage);
      puVar4 = *(undefined8 **)((long)ppQVar14 + lVar16);
      ppQVar14 = QList<QFormLayoutItem_*>::data(&(this->m_matrix).m_storage);
      puVar5 = *(undefined8 **)((long)ppQVar14 + lVar16 + 8);
      bVar9 = QFormLayout::isRowVisible(this_01,(int)uVar17);
      if (bVar9) {
        if ((puVar4 != (undefined8 *)0x0) && (iVar12 = *(int *)(puVar4 + 6), -1 < (long)iVar12)) {
          if (*(char *)((long)puVar4 + 10) == '\x01') {
            iVar11 = (**(code **)(*(long *)*puVar4 + 0x50))
                               ((long *)*puVar4,*(undefined4 *)(puVar4 + 7));
            iVar12 = *(int *)(puVar4 + 6);
            pQVar13 = QList<QLayoutStruct>::data(this_00);
            pQVar13[iVar12].minimumSize = iVar11;
            iVar12 = *(int *)(puVar4 + 6);
            pQVar13 = QList<QLayoutStruct>::data(this_00);
            pQVar13[iVar12].sizeHint = iVar11;
          }
          else {
            iVar11 = *(int *)(puVar4 + 3);
            pQVar13 = QList<QLayoutStruct>::data(this_00);
            pQVar13[iVar12].sizeHint = iVar11;
            iVar12 = *(int *)(puVar4 + 2);
            iVar11 = *(int *)(puVar4 + 6);
            pQVar13 = QList<QLayoutStruct>::data(this_00);
            pQVar13[iVar11].minimumSize = iVar12;
          }
        }
        if ((puVar5 != (undefined8 *)0x0) && (-1 < *(int *)(puVar5 + 6))) {
          bVar10 = *(byte *)((long)puVar5 + 10);
          iVar12 = 0;
          if (bVar10 == 1) {
            iVar12 = (**(code **)(*(long *)*puVar5 + 0x50))
                               ((long *)*puVar5,*(undefined4 *)(puVar5 + 7));
            bVar10 = *(byte *)((long)puVar5 + 10);
          }
          iVar11 = iVar12;
          if ((bVar10 & 1) == 0) {
            iVar12 = *(int *)(puVar5 + 2);
            iVar11 = *(int *)(puVar5 + 3);
          }
          iVar1 = *(int *)(puVar5 + 6);
          if (*(char *)((long)puVar5 + 0x2c) == '\x01') {
            pQVar3 = (this->hfwLayouts).d.ptr;
            iVar15 = pQVar3[iVar1].sizeHint;
            iVar2 = pQVar3[iVar1].minimumSize;
            if (iVar15 < iVar11) {
              iVar15 = iVar11;
            }
            pQVar13 = QList<QLayoutStruct>::data(this_00);
            pQVar13[iVar1].sizeHint = iVar15;
            if (iVar12 <= iVar2) {
              iVar12 = iVar2;
            }
          }
          else {
            pQVar13 = QList<QLayoutStruct>::data(this_00);
            pQVar13[iVar1].sizeHint = iVar11;
          }
          iVar11 = *(int *)(puVar5 + 6);
          pQVar13 = QList<QLayoutStruct>::data(this_00);
          pQVar13[iVar11].minimumSize = iVar12;
        }
      }
      uVar17 = uVar17 + 1;
      lVar16 = lVar16 + 0x10;
    } while ((local_58 & 0x7fffffff) != uVar17);
  }
  return;
}

Assistant:

void QFormLayoutPrivate::setupHfwLayoutData()
{
    Q_Q(QFormLayout);
    // setupVerticalLayoutData must be called before this
    // setupHorizontalLayoutData must also be called before this
    // copies non hfw data into hfw
    // then updates size and min


    // Note: QGridLayout doesn't call minimumHeightForWidth,
    // but instead uses heightForWidth for both min and sizeHint.
    // For the common case where minimumHeightForWidth just calls
    // heightForWidth, we do the calculation twice, which can be
    // very expensive for word wrapped QLabels/QTextEdits, for example.
    // So we just use heightForWidth as well.
    int i;
    int rr = m_matrix.rowCount();

    hfwLayouts.clear();
    hfwLayouts.resize(vLayoutCount);
    for (i = 0; i < vLayoutCount; ++i)
        hfwLayouts[i] = vLayouts.at(i);

    for (i = 0; i < rr; ++i) {
        QFormLayoutItem *label = m_matrix(i, 0);
        QFormLayoutItem *field = m_matrix(i, 1);

        // ignore rows with only hidden items
        if (!q->isRowVisible(i))
            continue;

        if (label && label->vLayoutIndex > -1) {
            if (label->isHfw) {
                // We don't check sideBySide here, since a label is only
                // ever side by side with its field
                int hfw = label->heightForWidth(label->layoutWidth);
                hfwLayouts[label->vLayoutIndex].minimumSize = hfw;
                hfwLayouts[label->vLayoutIndex].sizeHint = hfw;
            } else {
                // Reset these here, so the field can do a qMax below (the previous value may have
                // been the fields non-hfw values, which are often larger than hfw)
                hfwLayouts[label->vLayoutIndex].sizeHint = label->sizeHint.height();
                hfwLayouts[label->vLayoutIndex].minimumSize = label->minSize.height();
            }
        }

        if (field && field->vLayoutIndex > -1) {
            int hfw = field->isHfw ? field->heightForWidth(field->layoutWidth) : 0;
            int h = field->isHfw ? hfw : field->sizeHint.height();
            int mh = field->isHfw ? hfw : field->minSize.height();

            if (field->sideBySide) {
                int oh = hfwLayouts.at(field->vLayoutIndex).sizeHint;
                int omh = hfwLayouts.at(field->vLayoutIndex).minimumSize;

                hfwLayouts[field->vLayoutIndex].sizeHint = qMax(h, oh);
                hfwLayouts[field->vLayoutIndex].minimumSize = qMax(mh, omh);
            } else {
                hfwLayouts[field->vLayoutIndex].sizeHint = h;
                hfwLayouts[field->vLayoutIndex].minimumSize = mh;
            }
        }
    }
}